

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

void __thiscall
netlist::NetlistPortDeclaration::~NetlistPortDeclaration(NetlistPortDeclaration *this)

{
  NetlistPortDeclaration *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~NetlistPortDeclaration(in_RDI);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

NetlistPortDeclaration(const ast::Symbol& symbol) :
        NetlistNode(NodeKind::PortDeclaration, symbol) {}